

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  int64_t iVar7;
  int64_t iVar8;
  undefined1 *puVar9;
  ulong uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  int i;
  int index;
  ulong uVar13;
  NearestNeighborsIndex aIndex;
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex local_d0;
  NearestNeighborsIndex local_80;
  
  puVar11 = (undefined1 *)a->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar11 == (NearestNeighborsIndex *)0x0) {
    puVar11 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_d0,(NearestNeighborsIndex *)puVar11);
  puVar11 = (undefined1 *)b->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar11 == (NearestNeighborsIndex *)0x0) {
    puVar11 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_80,(NearestNeighborsIndex *)puVar11);
  if (local_d0.numberofdimensions_ == local_80.numberofdimensions_) {
    uVar13 = 0;
    if (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ !=
        local_80.floatsamples_.super_RepeatedPtrFieldBase.current_size_) goto LAB_002977b7;
    do {
      index = (int)uVar13;
      if (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ <= index) {
        if ((local_d0._oneof_case_[0] == local_80._oneof_case_[0]) &&
           (local_d0._oneof_case_[1] == local_80._oneof_case_[1])) {
          puVar11 = (undefined1 *)a->numberofneighbors_;
          if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
            puVar11 = _Int64Parameter_default_instance_;
          }
          puVar9 = (undefined1 *)b->numberofneighbors_;
          if ((Int64Parameter *)puVar9 == (Int64Parameter *)0x0) {
            puVar9 = _Int64Parameter_default_instance_;
          }
          if ((((Int64Parameter *)puVar11)->defaultvalue_ ==
               ((Int64Parameter *)puVar9)->defaultvalue_) &&
             (uVar2 = ((Int64Parameter *)puVar11)->_oneof_case_[0],
             uVar2 == ((Int64Parameter *)puVar9)->_oneof_case_[0])) {
            if (uVar2 == 0xb) {
              uVar3 = (((((Int64Parameter *)puVar11)->AllowedValues_).set_)->values_).current_size_;
              uVar13 = 0;
              if (uVar3 != (((((Int64Parameter *)puVar9)->AllowedValues_).set_)->values_).
                           current_size_) goto LAB_002977b7;
              uVar10 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar10 = uVar13;
              }
              uVar12 = 0;
              goto LAB_00297803;
            }
            if (uVar2 != 10) goto LAB_00297783;
            if ((((((Int64Parameter *)puVar11)->AllowedValues_).range_)->minvalue_ ==
                 ((((Int64Parameter *)puVar9)->AllowedValues_).range_)->minvalue_) &&
               (((((Int64Parameter *)puVar11)->AllowedValues_).range_)->maxvalue_ ==
                ((((Int64Parameter *)puVar9)->AllowedValues_).range_)->maxvalue_))
            goto LAB_00297783;
          }
        }
        break;
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,index);
      iVar1 = (pTVar5->vector_).current_size_;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_80.floatsamples_.super_RepeatedPtrFieldBase,index);
      if (iVar1 != (pTVar5->vector_).current_size_) break;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,index);
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                         (&local_80.floatsamples_.super_RepeatedPtrFieldBase,index);
      bVar4 = operator!=(&pTVar5->vector_,&pTVar6->vector_);
      uVar13 = (ulong)(index + 1);
    } while (!bVar4);
  }
LAB_002977b4:
  uVar13 = 0;
LAB_002977b7:
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_80);
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_d0);
  return SUB81(uVar13,0);
  while( true ) {
    puVar11 = (undefined1 *)a->numberofneighbors_;
    if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
      puVar11 = _Int64Parameter_default_instance_;
    }
    puVar9 = _Int64Set_default_instance_;
    if (((Int64Parameter *)puVar11)->_oneof_case_[0] == 0xb) {
      puVar9 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).set_;
    }
    iVar7 = Int64Set::_internal_values((Int64Set *)puVar9,(int)uVar12);
    puVar11 = (undefined1 *)b->numberofneighbors_;
    if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
      puVar11 = _Int64Parameter_default_instance_;
    }
    puVar9 = _Int64Set_default_instance_;
    if (((Int64Parameter *)puVar11)->_oneof_case_[0] == 0xb) {
      puVar9 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).set_;
    }
    iVar8 = Int64Set::_internal_values((Int64Set *)puVar9,(int)uVar12);
    uVar12 = uVar12 + 1;
    uVar13 = 0;
    if (iVar7 != iVar8) break;
LAB_00297803:
    if (uVar10 == uVar12) goto LAB_00297783;
  }
  goto LAB_002977b7;
LAB_00297783:
  uVar2 = a->_oneof_case_[0];
  if (uVar2 == b->_oneof_case_[0]) {
    if (uVar2 == 0) {
      uVar13 = 1;
      goto LAB_002977b7;
    }
    if (uVar2 == 100) {
      bVar4 = vectorsEqual<CoreML::Specification::StringVector>
                        ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_);
    }
    else {
      if (uVar2 != 0x65) goto LAB_002977b4;
      bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>
                        ((a->ClassLabels_).int64classlabels_,(b->ClassLabels_).int64classlabels_);
    }
    uVar13 = (ulong)bVar4;
    goto LAB_002977b7;
  }
  goto LAB_002977b4;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }